

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_test.cc
# Opt level: O3

void __thiscall BufTest_Append_Test::TestBody(BufTest_Append_Test *this)

{
  int iVar1;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr_2;
  string str;
  UniquePtr<BUF_MEM> buf;
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  _Head_base<0UL,_buf_mem_st_*,_false> local_28;
  AssertHelper local_20;
  
  local_28._M_head_impl = (buf_mem_st *)BUF_MEM_new();
  local_88[0] = (internal)(local_28._M_head_impl != (buf_mem_st *)0x0);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28._M_head_impl == (buf_mem_st *)0x0) {
    testing::Message::Message((Message *)local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_88,(AssertionResult *)0x55fc2f,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
               ,0x57,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_48);
  }
  else {
    iVar1 = BUF_MEM_append(local_28._M_head_impl,(void *)0x0,0);
    local_88[0] = (internal)(iVar1 != 0);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_48);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(internal *)local_88,
                 (AssertionResult *)"BUF_MEM_append(buf.get(), nullptr, 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x59,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_48);
    }
    else {
      iVar1 = BUF_MEM_append(local_28._M_head_impl,"hello ",6);
      local_88[0] = (internal)(iVar1 != 0);
      local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)local_48);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,(internal *)local_88,
                   (AssertionResult *)"BUF_MEM_append(buf.get(), \"hello \", 6)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                   ,0x5a,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)local_48);
      }
      else {
        iVar1 = BUF_MEM_append(local_28._M_head_impl,(void *)0x0,0);
        local_88[0] = (internal)(iVar1 != 0);
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)local_48);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_68,(internal *)local_88,
                     (AssertionResult *)"BUF_MEM_append(buf.get(), nullptr, 0)","false","true",in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                     ,0x5b,local_68._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)local_48);
        }
        else {
          iVar1 = BUF_MEM_append(local_28._M_head_impl,"world",5);
          local_88[0] = (internal)(iVar1 != 0);
          local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_88[0]) {
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_68,-0x80);
            iVar1 = BUF_MEM_append(local_28._M_head_impl,local_68._M_dataplus._M_p,
                                   local_68._M_string_length);
            local_48[0] = iVar1 != 0;
            local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&local_98);
              this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_40;
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_88,(internal *)local_48,
                         (AssertionResult *)"BUF_MEM_append(buf.get(), str.data(), str.size())",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_20,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                         ,0x5e,(char *)CONCAT71(local_88._1_7_,local_88[0]));
              testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_98);
              testing::internal::AssertHelper::~AssertHelper(&local_20);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_88._1_7_,local_88[0]),
                                local_78._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_98.data_._1_7_,local_98.data_._0_1_) + 8))();
              }
              local_90 = local_40;
              if (local_40 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
              goto LAB_0020a2a6;
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88,"hello world",&local_68);
              local_48 = (undefined1  [8])&local_38;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_48,(local_28._M_head_impl)->data,
                         (local_28._M_head_impl)->data + (local_28._M_head_impl)->length);
              testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                        ((internal *)&local_98,"\"hello world\" + str",
                         "std::string(buf->data, buf->length)",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48);
              if (local_48 != (undefined1  [8])&local_38) {
                operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_88._1_7_,local_88[0]),
                                local_78._M_allocated_capacity + 1);
              }
              if (local_98.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)local_88);
                if (local_90 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  message = "";
                }
                else {
                  message = (local_90->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                           ,0x60,message);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_48,(Message *)local_88);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
                if ((long *)CONCAT71(local_88._1_7_,local_88[0]) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(local_88._1_7_,local_88[0]) + 8))();
                }
              }
              if (local_90 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_90;
LAB_0020a2a6:
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()(this_00,local_90);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0020a194;
          }
          testing::Message::Message((Message *)local_48);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_68,(internal *)local_88,
                     (AssertionResult *)"BUF_MEM_append(buf.get(), \"world\", 5)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                     ,0x5c,local_68._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)local_48);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_48 + 8))();
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
LAB_0020a194:
  std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)&local_28);
  return;
}

Assistant:

TEST(BufTest, Append) {
  bssl::UniquePtr<BUF_MEM> buf(BUF_MEM_new());
  ASSERT_TRUE(buf);

  ASSERT_TRUE(BUF_MEM_append(buf.get(), nullptr, 0));
  ASSERT_TRUE(BUF_MEM_append(buf.get(), "hello ", 6));
  ASSERT_TRUE(BUF_MEM_append(buf.get(), nullptr, 0));
  ASSERT_TRUE(BUF_MEM_append(buf.get(), "world", 5));
  std::string str(128, 'A');
  ASSERT_TRUE(BUF_MEM_append(buf.get(), str.data(), str.size()));

  EXPECT_EQ("hello world" + str, std::string(buf->data, buf->length));
}